

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

string * include_file(string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  reference __lhs;
  allocator local_21e1;
  undefined1 local_21e0 [8];
  stat finfo_1;
  char local_2148 [8];
  char rp_1 [4096];
  undefined1 local_1128 [8];
  string sfilename;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10f8;
  iterator it;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10e8;
  const_iterator local_10e0;
  undefined1 local_10d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sp;
  allocator local_10a9;
  undefined1 local_10a8 [8];
  stat finfo;
  char rp [4096];
  string *filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)filename);
  if (*pcVar3 == '/') {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar3 = saferealpath(pcVar3,(char *)(finfo.__glibc_reserved + 2));
    if (pcVar3 == (char *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      pwarning(0,"Cannot open include file %s\n",uVar4);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    iVar2 = stat((char *)(finfo.__glibc_reserved + 2),(stat *)local_10a8);
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(char *)(finfo.__glibc_reserved + 2),&local_10a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
      return __return_storage_ptr__;
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_10d8,&g_incl_searchpath_abi_cxx11_);
    local_10e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_10d8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_10e0,&local_10e8);
    it = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_10d8,local_10e0,&g_curdir_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_10f8);
    local_10f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_10d8);
    while( true ) {
      sfilename.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_10d8);
      bVar1 = __gnu_cxx::operator!=
                        (&local_10f8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&sfilename.field_2 + 8));
      if (!bVar1) break;
      __lhs = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_10f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (rp_1 + 0xff8),__lhs,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (rp_1 + 0xff8),filename);
      std::__cxx11::string::~string((string *)(rp_1 + 0xff8));
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar3 = saferealpath(pcVar3,local_2148);
      if (pcVar3 == (char *)0x0) {
        finfo_1.__glibc_reserved[2]._4_4_ = 4;
      }
      else {
        iVar2 = stat(local_2148,(stat *)local_21e0);
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,local_2148,&local_21e1);
          std::allocator<char>::~allocator((allocator<char> *)&local_21e1);
          finfo_1.__glibc_reserved[2]._4_4_ = 1;
        }
        else {
          finfo_1.__glibc_reserved[2]._4_4_ = 0;
        }
      }
      std::__cxx11::string::~string((string *)local_1128);
      if ((finfo_1.__glibc_reserved[2]._4_4_ != 0) && (finfo_1.__glibc_reserved[2]._4_4_ != 4))
      goto LAB_0016ec24;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_10f8,0);
    }
    finfo_1.__glibc_reserved[2]._4_4_ = 0;
LAB_0016ec24:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_10d8);
    if (finfo_1.__glibc_reserved[2]._4_4_ != 0) {
      return __return_storage_ptr__;
    }
  }
  uVar4 = std::__cxx11::string::c_str();
  pwarning(0,"Could not find include file %s\n",uVar4);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string include_file(string filename) {
    // Absolute path? Just try that
    if (filename[0] == '/') {
        // Realpath!
        char rp[THRIFT_PATH_MAX];
        // cppcheck-suppress uninitvar
        if (saferealpath(filename.c_str(), rp) == nullptr) {
            pwarning(0, "Cannot open include file %s\n", filename.c_str());
            return std::string();
        }

        // Stat this file
        struct stat finfo;
        if (stat(rp, &finfo) == 0) {
            return rp;
        }
    } else { // relative path, start searching
        // new search path with current dir global
        vector<string> sp = g_incl_searchpath;
        sp.insert(sp.begin(), g_curdir);

        // iterate through paths
        vector<string>::iterator it;
        for (it = sp.begin(); it != sp.end(); it++) {
            string sfilename = *(it) + "/" + filename;

            // Realpath!
            char rp[THRIFT_PATH_MAX];
            // cppcheck-suppress uninitvar
            if (saferealpath(sfilename.c_str(), rp) == nullptr) {
                continue;
            }

            // Stat this files
            struct stat finfo;
            if (stat(rp, &finfo) == 0) {
                return rp;
            }
        }
    }

    // Uh oh
    pwarning(0, "Could not find include file %s\n", filename.c_str());
    return std::string();
}